

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O1

CharBuff * new_buff(uint size)

{
  CharBuff *pCVar1;
  char *__s;
  uint uVar2;
  
  pCVar1 = (CharBuff *)malloc(0x18);
  uVar2 = size + 1;
  __s = (char *)malloc((ulong)uVar2 + 1);
  pCVar1->body = __s;
  pCVar1->len = 0;
  pCVar1->init_size = uVar2;
  pCVar1->buff_size = uVar2;
  memset(__s,0,(ulong)uVar2);
  return pCVar1;
}

Assistant:

CharBuff* new_buff(uint size){
    CharBuff* buff = malloc(sizeof(CharBuff));
    size =  MALLOC_SIZE(char, +size);
    buff->body = malloc(MALLOC_SIZE(char, +size));
    buff->len = 0;
    buff->init_size = size;
    buff->buff_size = size;
    buff_zero(buff->body, size);
    return buff;
}